

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

int ShowDemoWindowWidgets::Funcs::MyResizeCallback(ImGuiInputTextCallbackData *data)

{
  ImVector<char> *this;
  char *pcVar1;
  ImVector<char> *my_str;
  ImGuiInputTextCallbackData *data_local;
  
  if (data->EventFlag == 0x40000) {
    this = (ImVector<char> *)data->UserData;
    pcVar1 = ImVector<char>::begin(this);
    if (pcVar1 != data->Buf) {
      __assert_fail("my_str->begin() == data->Buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_demo.cpp"
                    ,0x40d,
                    "static int ShowDemoWindowWidgets()::Funcs::MyResizeCallback(ImGuiInputTextCallbackData *)"
                   );
    }
    ImVector<char>::resize(this,data->BufSize);
    pcVar1 = ImVector<char>::begin(this);
    data->Buf = pcVar1;
  }
  return 0;
}

Assistant:

static int MyResizeCallback(ImGuiInputTextCallbackData* data)
                {
                    if (data->EventFlag == ImGuiInputTextFlags_CallbackResize)
                    {
                        ImVector<char>* my_str = (ImVector<char>*)data->UserData;
                        IM_ASSERT(my_str->begin() == data->Buf);
                        my_str->resize(data->BufSize);  // NB: On resizing calls, generally data->BufSize == data->BufTextLen + 1
                        data->Buf = my_str->begin();
                    }
                    return 0;
                }